

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O0

void __thiscall cppcms::http::details::basic_device::~basic_device(basic_device *this)

{
  cgi_headers_parser *in_RDI;
  vector<char,_std::allocator<char>_> *unaff_retaddr;
  
  *(undefined ***)&in_RDI->header_ = &PTR__basic_device_0052af28;
  std::vector<char,_std::allocator<char>_>::~vector(unaff_retaddr);
  cppcms::impl::cgi_headers_parser::~cgi_headers_parser(in_RDI);
  std::weak_ptr<cppcms::impl::cgi::connection>::~weak_ptr
            ((weak_ptr<cppcms::impl::cgi::connection> *)0x39e4b9);
  extended_streambuf::~extended_streambuf((extended_streambuf *)0x39e4c3);
  return;
}

Assistant:

basic_device() : 
			raw_mode_(false),
			final_(false),
			eof_send_(false),
			buffer_size_(0)
		{
		}